

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int spacePop(xmlParserCtxtPtr ctxt)

{
  int ret;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->spaceNr < 1) {
    ctxt_local._4_4_ = 0;
  }
  else {
    ctxt->spaceNr = ctxt->spaceNr + -1;
    if (ctxt->spaceNr < 1) {
      ctxt->space = ctxt->spaceTab;
    }
    else {
      ctxt->space = ctxt->spaceTab + (ctxt->spaceNr + -1);
    }
    ctxt_local._4_4_ = ctxt->spaceTab[ctxt->spaceNr];
    ctxt->spaceTab[ctxt->spaceNr] = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int spacePop(xmlParserCtxtPtr ctxt) {
    int ret;
    if (ctxt->spaceNr <= 0) return(0);
    ctxt->spaceNr--;
    if (ctxt->spaceNr > 0)
	ctxt->space = &ctxt->spaceTab[ctxt->spaceNr - 1];
    else
        ctxt->space = &ctxt->spaceTab[0];
    ret = ctxt->spaceTab[ctxt->spaceNr];
    ctxt->spaceTab[ctxt->spaceNr] = -1;
    return(ret);
}